

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::updateOkButton(QFileDialogPrivate *this)

{
  bool bVar1;
  FileMode FVar2;
  Ui_QFileDialog *pUVar3;
  QPushButton *pQVar4;
  ulong uVar5;
  long lVar6;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar7;
  QString *file;
  QStringList *__range4;
  long maxLength;
  bool isOpenDirectory;
  bool enableButton;
  FileMode fileMode;
  QPushButton *button;
  QFileDialog *q;
  QModelIndex idx_2;
  const_iterator __end4;
  const_iterator __begin4;
  QString fileName;
  QString fileDir;
  QModelIndex idx_1;
  QFileInfo info;
  QString fn_1;
  QModelIndex idx;
  QString fn;
  QString lineEditText;
  QStringList files;
  int iVar8;
  QString *in_stack_fffffffffffffd58;
  undefined5 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd65;
  undefined1 in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  byte bVar9;
  QFileDialogPrivate *in_stack_fffffffffffffd68;
  QFileDialogPrivate *in_stack_fffffffffffffd70;
  undefined4 uVar10;
  StandardButton which;
  QDialogButtonBox *this_00;
  QFileDialog *in_stack_fffffffffffffda0;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  QString *local_1d0;
  const_iterator local_1c8;
  const_iterator local_1c0;
  QDir local_1b8 [80];
  undefined1 local_168 [30];
  QChar local_14a;
  undefined1 local_148 [48];
  QString local_118;
  QString local_100;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QLatin1StringView local_50;
  QChar local_3a;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = SUB84(in_RDI,0);
  which = (StandardButton)((ulong)in_RDI >> 0x20);
  q_func(in_RDI);
  pUVar3 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                     ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                      (CONCAT44(which,uVar10) + 0x370));
  this_00 = pUVar3->buttonBox;
  QFileDialog::acceptMode
            ((QFileDialog *)
             CONCAT17(in_stack_fffffffffffffd67,
                      CONCAT16(in_stack_fffffffffffffd66,
                               CONCAT15(in_stack_fffffffffffffd65,in_stack_fffffffffffffd60))));
  pQVar4 = QDialogButtonBox::button(this_00,which);
  if (pQVar4 == (QPushButton *)0x0) goto LAB_00758e11;
  FVar2 = QFileDialog::fileMode
                    ((QFileDialog *)
                     CONCAT17(in_stack_fffffffffffffd67,
                              CONCAT16(in_stack_fffffffffffffd66,
                                       CONCAT15(in_stack_fffffffffffffd65,in_stack_fffffffffffffd60)
                                      )));
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QFileDialog::selectedFiles(in_stack_fffffffffffffda0);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  lineEdit((QFileDialogPrivate *)0x7584ca);
  QLineEdit::text((QLineEdit *)in_stack_fffffffffffffd68);
  QVar7 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffd68,
                     CONCAT17(in_stack_fffffffffffffd67,
                              CONCAT16(in_stack_fffffffffffffd66,
                                       CONCAT15(in_stack_fffffffffffffd65,in_stack_fffffffffffffd60)
                                      )));
  uVar5 = QString::startsWith((QLatin1String *)&local_38,(CaseSensitivity)QVar7.m_size);
  if ((uVar5 & 1) == 0) {
    QChar::QChar<char16_t,_true>(&local_3a,L'\\');
    uVar5 = QString::startsWith((QChar *)&local_38,(uint)(ushort)local_3a.ucs);
    if ((uVar5 & 1) != 0) goto LAB_00758547;
    bVar1 = QList<QString>::isEmpty((QList<QString> *)0x75857c);
    if (!bVar1) {
      local_50 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffd68,
                            CONCAT17(in_stack_fffffffffffffd67,
                                     CONCAT16(in_stack_fffffffffffffd66,
                                              CONCAT15(in_stack_fffffffffffffd65,
                                                       in_stack_fffffffffffffd60))));
      bVar1 = ::operator==((QString *)in_stack_fffffffffffffd68,
                           (QLatin1StringView *)
                           CONCAT17(in_stack_fffffffffffffd67,
                                    CONCAT16(in_stack_fffffffffffffd66,
                                             CONCAT15(in_stack_fffffffffffffd65,
                                                      in_stack_fffffffffffffd60))));
      if (!bVar1) {
        in_stack_fffffffffffffd70 = (QFileDialogPrivate *)(ulong)FVar2;
        switch(in_stack_fffffffffffffd70) {
        case (QFileDialogPrivate *)0x0:
          local_c8 = &DAT_aaaaaaaaaaaaaaaa;
          local_c0 = &DAT_aaaaaaaaaaaaaaaa;
          local_b8 = &DAT_aaaaaaaaaaaaaaaa;
          QList<QString>::first
                    ((QList<QString> *)
                     CONCAT17(in_stack_fffffffffffffd67,
                              CONCAT16(in_stack_fffffffffffffd66,
                                       CONCAT15(in_stack_fffffffffffffd65,in_stack_fffffffffffffd60)
                                      )));
          QString::QString((QString *)
                           CONCAT17(in_stack_fffffffffffffd67,
                                    CONCAT16(in_stack_fffffffffffffd66,
                                             CONCAT15(in_stack_fffffffffffffd65,
                                                      in_stack_fffffffffffffd60))),
                           in_stack_fffffffffffffd58);
          local_d0 = &DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_d0,(QString *)&local_c8);
          local_e8 = &DAT_aaaaaaaaaaaaaaaa;
          local_e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_d8 = &DAT_aaaaaaaaaaaaaaaa;
          QFileSystemModel::index
                    ((QString *)&local_e8,(int)*(undefined8 *)(CONCAT44(which,uVar10) + 0x300));
          local_100.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_100.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_100.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QString::QString((QString *)0x75886c);
          local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QString::QString((QString *)0x7588a6);
          uVar5 = QFileInfo::isDir();
          if ((uVar5 & 1) == 0) {
            QChar::QChar<char16_t,_true>(&local_14a,L'/');
            QString::lastIndexOf
                      ((QString *)
                       CONCAT17(in_stack_fffffffffffffd67,
                                CONCAT16(in_stack_fffffffffffffd66,
                                         CONCAT15(in_stack_fffffffffffffd65,
                                                  in_stack_fffffffffffffd60))),
                       (QChar)(char16_t)((ulong)in_stack_fffffffffffffd68 >> 0x30),
                       (CaseSensitivity)((ulong)in_stack_fffffffffffffd58 >> 0x20));
            QString::mid((longlong)local_148,(longlong)&local_c8);
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffd67,
                                        CONCAT16(in_stack_fffffffffffffd66,
                                                 CONCAT15(in_stack_fffffffffffffd65,
                                                          in_stack_fffffffffffffd60))),
                               in_stack_fffffffffffffd58);
            QString::~QString((QString *)0x75895f);
            QString::size(&local_100);
            QString::mid((longlong)local_168,(longlong)&local_c8);
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffd67,
                                        CONCAT16(in_stack_fffffffffffffd66,
                                                 CONCAT15(in_stack_fffffffffffffd65,
                                                          in_stack_fffffffffffffd60))),
                               in_stack_fffffffffffffd58);
            QString::~QString((QString *)0x7589b1);
          }
          else {
            QFileInfo::canonicalFilePath();
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffd67,
                                        CONCAT16(in_stack_fffffffffffffd66,
                                                 CONCAT15(in_stack_fffffffffffffd65,
                                                          in_stack_fffffffffffffd60))),
                               in_stack_fffffffffffffd58);
            QString::~QString((QString *)0x7588f0);
          }
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffd68,
                     CONCAT17(in_stack_fffffffffffffd67,
                              CONCAT16(in_stack_fffffffffffffd66,
                                       CONCAT15(in_stack_fffffffffffffd65,in_stack_fffffffffffffd60)
                                      )));
          QVar7.m_data._0_4_ = uVar10;
          QVar7.m_size = (qsizetype)in_stack_fffffffffffffd70;
          QVar7.m_data._4_4_ = which;
          bVar1 = QString::contains(in_stack_fffffffffffffd58,QVar7,CaseInsensitive);
          if (bVar1) {
            QFileInfo::canonicalFilePath();
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffd67,
                                        CONCAT16(in_stack_fffffffffffffd66,
                                                 CONCAT15(in_stack_fffffffffffffd65,
                                                          in_stack_fffffffffffffd60))),
                               in_stack_fffffffffffffd58);
            QString::~QString((QString *)0x758a25);
            QFileInfo::fileName();
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffd67,
                                        CONCAT16(in_stack_fffffffffffffd66,
                                                 CONCAT15(in_stack_fffffffffffffd65,
                                                          in_stack_fffffffffffffd60))),
                               in_stack_fffffffffffffd58);
            QString::~QString((QString *)0x758a5c);
          }
          QFileDialog::directory((QFileDialog *)CONCAT44(which,uVar10));
          QDir::canonicalPath();
          bVar1 = ::operator==((QString *)
                               CONCAT17(in_stack_fffffffffffffd67,
                                        CONCAT16(in_stack_fffffffffffffd66,
                                                 CONCAT15(in_stack_fffffffffffffd65,
                                                          in_stack_fffffffffffffd60))),
                               in_stack_fffffffffffffd58);
          bVar9 = false;
          if (bVar1) {
            bVar9 = QString::isEmpty((QString *)0x758ab7);
          }
          in_stack_fffffffffffffd67 = bVar9;
          QString::~QString((QString *)0x758ad0);
          QDir::~QDir(local_1b8);
          if ((((bVar9 & 1) == 0) &&
              (((bVar1 = QModelIndex::isValid
                                   ((QModelIndex *)
                                    CONCAT17(in_stack_fffffffffffffd67,
                                             CONCAT16(bVar9,CONCAT15(in_stack_fffffffffffffd65,
                                                                     in_stack_fffffffffffffd60)))),
                !bVar1 || (uVar5 = QFileSystemModel::isDir
                                             (*(QModelIndex **)(CONCAT44(which,uVar10) + 0x300)),
                          (uVar5 & 1) == 0)) &&
               (bVar1 = QModelIndex::isValid
                                  ((QModelIndex *)
                                   CONCAT17(in_stack_fffffffffffffd67,
                                            CONCAT16(bVar9,CONCAT15(in_stack_fffffffffffffd65,
                                                                    in_stack_fffffffffffffd60)))),
               !bVar1)))) &&
             (lVar6 = maxNameLength((QString *)
                                    CONCAT17(in_stack_fffffffffffffd67,
                                             CONCAT16(bVar9,CONCAT15(in_stack_fffffffffffffd65,
                                                                     in_stack_fffffffffffffd60)))),
             -1 < lVar6)) {
            QString::size(&local_118);
          }
          QString::~QString((QString *)0x758ba8);
          QString::~QString((QString *)0x758bb5);
          QFileInfo::~QFileInfo((QFileInfo *)&local_d0);
          QString::~QString((QString *)0x758bcf);
          break;
        case (QFileDialogPrivate *)0x1:
        case (QFileDialogPrivate *)0x3:
          local_1c0.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
          local_1c0 = QList<QString>::begin
                                ((QList<QString> *)
                                 CONCAT17(in_stack_fffffffffffffd67,
                                          CONCAT16(in_stack_fffffffffffffd66,
                                                   CONCAT15(in_stack_fffffffffffffd65,
                                                            in_stack_fffffffffffffd60))));
          local_1c8.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
          local_1c8 = QList<QString>::end((QList<QString> *)
                                          CONCAT17(in_stack_fffffffffffffd67,
                                                   CONCAT16(in_stack_fffffffffffffd66,
                                                            CONCAT15(in_stack_fffffffffffffd65,
                                                                     in_stack_fffffffffffffd60))));
          while( true ) {
            local_1d0 = local_1c8.i;
            bVar1 = QList<QString>::const_iterator::operator!=(&local_1c0,local_1c8);
            if (!bVar1) break;
            QList<QString>::const_iterator::operator*(&local_1c0);
            local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
            local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
            local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
            QFileSystemModel::index
                      ((QString *)&local_1e8,(int)*(undefined8 *)(CONCAT44(which,uVar10) + 0x300));
            bVar1 = QModelIndex::isValid
                              ((QModelIndex *)
                               CONCAT17(in_stack_fffffffffffffd67,
                                        CONCAT16(in_stack_fffffffffffffd66,
                                                 CONCAT15(in_stack_fffffffffffffd65,
                                                          in_stack_fffffffffffffd60))));
            if (!bVar1) {
              iVar8 = (int)*(undefined8 *)(CONCAT44(which,uVar10) + 0x300);
              getEnvironmentVariable(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68)
              ;
              QFileSystemModel::index((QString *)&local_200,iVar8);
              local_1e8 = local_200;
              local_1e0 = local_1f8;
              local_1d8 = local_1f0;
              QString::~QString((QString *)0x758d5c);
            }
            bVar1 = QModelIndex::isValid
                              ((QModelIndex *)
                               CONCAT17(in_stack_fffffffffffffd67,
                                        CONCAT16(in_stack_fffffffffffffd66,
                                                 CONCAT15(in_stack_fffffffffffffd65,
                                                          in_stack_fffffffffffffd60))));
            if ((!bVar1) ||
               ((bVar1 = QModelIndex::isValid
                                   ((QModelIndex *)
                                    CONCAT17(in_stack_fffffffffffffd67,
                                             CONCAT16(in_stack_fffffffffffffd66,
                                                      CONCAT15(in_stack_fffffffffffffd65,
                                                               in_stack_fffffffffffffd60)))), bVar1
                && (uVar5 = QFileSystemModel::isDir
                                      (*(QModelIndex **)(CONCAT44(which,uVar10) + 0x300)),
                   (uVar5 & 1) != 0)))) break;
            QList<QString>::const_iterator::operator++(&local_1c0);
          }
          break;
        case (QFileDialogPrivate *)0x2:
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          QList<QString>::first
                    ((QList<QString> *)
                     CONCAT17(in_stack_fffffffffffffd67,
                              CONCAT16(in_stack_fffffffffffffd66,
                                       CONCAT15(in_stack_fffffffffffffd65,in_stack_fffffffffffffd60)
                                      )));
          QString::QString((QString *)
                           CONCAT17(in_stack_fffffffffffffd67,
                                    CONCAT16(in_stack_fffffffffffffd66,
                                             CONCAT15(in_stack_fffffffffffffd65,
                                                      in_stack_fffffffffffffd60))),
                           in_stack_fffffffffffffd58);
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_70 = &DAT_aaaaaaaaaaaaaaaa;
          QFileSystemModel::index
                    ((QString *)&local_80,(int)*(undefined8 *)(CONCAT44(which,uVar10) + 0x300));
          bVar1 = QModelIndex::isValid
                            ((QModelIndex *)
                             CONCAT17(in_stack_fffffffffffffd67,
                                      CONCAT16(in_stack_fffffffffffffd66,
                                               CONCAT15(in_stack_fffffffffffffd65,
                                                        in_stack_fffffffffffffd60))));
          if (!bVar1) {
            in_stack_fffffffffffffd68 = *(QFileDialogPrivate **)(CONCAT44(which,uVar10) + 0x300);
            getEnvironmentVariable(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
            QFileSystemModel::index((QString *)&local_98,(int)in_stack_fffffffffffffd68);
            local_80 = local_98;
            local_78 = local_90;
            local_70 = local_88;
            QString::~QString((QString *)0x758725);
          }
          bVar1 = QModelIndex::isValid
                            ((QModelIndex *)
                             CONCAT17(in_stack_fffffffffffffd67,
                                      CONCAT16(in_stack_fffffffffffffd66,
                                               CONCAT15(in_stack_fffffffffffffd65,
                                                        in_stack_fffffffffffffd60))));
          if (bVar1) {
            QFileSystemModel::isDir(*(QModelIndex **)(CONCAT44(which,uVar10) + 0x300));
          }
          QString::~QString((QString *)0x75876f);
        }
      }
    }
    QWidget::setEnabled((QWidget *)in_stack_fffffffffffffd70,
                        SUB81((ulong)in_stack_fffffffffffffd68 >> 0x38,0));
    updateOkButtonText(in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
  }
  else {
LAB_00758547:
    QWidget::setEnabled((QWidget *)in_stack_fffffffffffffd70,
                        SUB81((ulong)in_stack_fffffffffffffd68 >> 0x38,0));
    updateOkButtonText(in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
  }
  QString::~QString((QString *)0x758e04);
  QList<QString>::~QList((QList<QString> *)0x758e11);
LAB_00758e11:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::updateOkButton()
{
    Q_Q(QFileDialog);
    QPushButton *button =  qFileDialogUi->buttonBox->button((q->acceptMode() == QFileDialog::AcceptOpen)
                    ? QDialogButtonBox::Open : QDialogButtonBox::Save);
    if (!button)
        return;
    const QFileDialog::FileMode fileMode = q->fileMode();

    bool enableButton = true;
    bool isOpenDirectory = false;

    const QStringList files = q->selectedFiles();
    QString lineEditText = lineEdit()->text();

    if (lineEditText.startsWith("//"_L1) || lineEditText.startsWith(u'\\')) {
        button->setEnabled(true);
        updateOkButtonText();
        return;
    }

    if (files.isEmpty()) {
        enableButton = false;
    } else if (lineEditText == ".."_L1) {
        isOpenDirectory = true;
    } else {
        switch (fileMode) {
        case QFileDialog::Directory: {
            QString fn = files.first();
            QModelIndex idx = model->index(fn);
            if (!idx.isValid())
                idx = model->index(getEnvironmentVariable(fn));
            if (!idx.isValid() || !model->isDir(idx))
                enableButton = false;
            break;
        }
        case QFileDialog::AnyFile: {
            QString fn = files.first();
            QFileInfo info(fn);
            QModelIndex idx = model->index(fn);
            QString fileDir;
            QString fileName;
            if (info.isDir()) {
                fileDir = info.canonicalFilePath();
            } else {
                fileDir = fn.mid(0, fn.lastIndexOf(u'/'));
                fileName = fn.mid(fileDir.size() + 1);
            }
            if (lineEditText.contains(".."_L1)) {
                fileDir = info.canonicalFilePath();
                fileName = info.fileName();
            }

            if (fileDir == q->directory().canonicalPath() && fileName.isEmpty()) {
                enableButton = false;
                break;
            }
            if (idx.isValid() && model->isDir(idx)) {
                isOpenDirectory = true;
                enableButton = true;
                break;
            }
            if (!idx.isValid()) {
                const long maxLength = maxNameLength(fileDir);
                enableButton = maxLength < 0 || fileName.size() <= maxLength;
            }
            break;
        }
        case QFileDialog::ExistingFile:
        case QFileDialog::ExistingFiles:
            for (const auto &file : files) {
                QModelIndex idx = model->index(file);
                if (!idx.isValid())
                    idx = model->index(getEnvironmentVariable(file));
                if (!idx.isValid()) {
                    enableButton = false;
                    break;
                }
                if (idx.isValid() && model->isDir(idx)) {
                    isOpenDirectory = true;
                    break;
                }
            }
            break;
        default:
            break;
        }
    }

    button->setEnabled(enableButton);
    updateOkButtonText(isOpenDirectory);
}